

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O0

SSL_CIPHER * __thiscall
bssl::ssl_choose_tls13_cipher
          (bssl *this,CBS cipher_suites,bool has_aes_hw,uint16_t version,
          ssl_compliance_policy_t policy)

{
  ushort uVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  size_t sVar5;
  SSL_CIPHER *cipher;
  undefined7 in_register_00000009;
  undefined2 in_register_00000082;
  CNsaCipherScorer *local_88;
  Score candidate_score;
  SSL_CIPHER *candidate;
  uint16_t local_66 [4];
  uint16_t cipher_suite;
  int local_54;
  CNsaCipherScorer *pCStack_50;
  Score best_score;
  CipherScorer *scorer;
  CNsaCipherScorer cnsa_scorer;
  AesHwCipherScorer aes_hw_scorer;
  SSL_CIPHER *best;
  ssl_compliance_policy_t policy_local;
  uint16_t version_local;
  bool has_aes_hw_local;
  CBS cipher_suites_local;
  
  cipher_suites_local.data = cipher_suites.data;
  uVar1 = (ushort)CONCAT71(in_register_00000009,has_aes_hw);
  _policy_local = this;
  sVar5 = CBS_len((CBS *)&policy_local);
  if ((sVar5 & 1) == 0) {
    aes_hw_scorer.aes_is_fine_ = false;
    aes_hw_scorer._9_7_ = 0;
    anon_unknown_3::AesHwCipherScorer::AesHwCipherScorer
              ((AesHwCipherScorer *)&cnsa_scorer,(bool)((byte)cipher_suites.len & 1));
    anon_unknown_3::CNsaCipherScorer::CNsaCipherScorer((CNsaCipherScorer *)&scorer);
    if (CONCAT22(in_register_00000082,version) == ssl_compliance_policy_cnsa_202407) {
      local_88 = (CNsaCipherScorer *)&scorer;
    }
    else {
      local_88 = &cnsa_scorer;
    }
    pCStack_50 = local_88;
    local_54 = 0;
    while (sVar5 = CBS_len((CBS *)&policy_local), sVar5 != 0) {
      iVar4 = CBS_get_u16((CBS *)&policy_local,local_66);
      if (iVar4 == 0) {
        cipher_suites_local.len = 0;
        goto LAB_00360955;
      }
      cipher = SSL_get_cipher_by_value(local_66[0]);
      if (((cipher != (SSL_CIPHER *)0x0) &&
          (uVar3 = SSL_CIPHER_get_min_version(cipher), uVar3 <= uVar1)) &&
         (uVar3 = SSL_CIPHER_get_max_version(cipher), uVar1 <= uVar3)) {
        uVar3 = SSL_CIPHER_get_protocol_id(cipher);
        bVar2 = ssl_tls13_cipher_meets_policy(uVar3,CONCAT22(in_register_00000082,version));
        if ((bVar2) &&
           (iVar4 = (*(code *)((CipherScorer *)(pCStack_50->super_CipherScorer)._vptr_CipherScorer)
                              [2]._vptr_CipherScorer)(pCStack_50,cipher), local_54 < iVar4)) {
          local_54 = iVar4;
          aes_hw_scorer._8_8_ = cipher;
        }
      }
    }
    cipher_suites_local.len = aes_hw_scorer._8_8_;
LAB_00360955:
    anon_unknown_3::CNsaCipherScorer::~CNsaCipherScorer((CNsaCipherScorer *)&scorer);
    anon_unknown_3::AesHwCipherScorer::~AesHwCipherScorer((AesHwCipherScorer *)&cnsa_scorer);
  }
  else {
    cipher_suites_local.len = 0;
  }
  return (SSL_CIPHER *)cipher_suites_local.len;
}

Assistant:

const SSL_CIPHER *ssl_choose_tls13_cipher(CBS cipher_suites, bool has_aes_hw,
                                          uint16_t version,
                                          enum ssl_compliance_policy_t policy) {
  if (CBS_len(&cipher_suites) % 2 != 0) {
    return nullptr;
  }

  const SSL_CIPHER *best = nullptr;
  AesHwCipherScorer aes_hw_scorer(has_aes_hw);
  CNsaCipherScorer cnsa_scorer;
  CipherScorer *const scorer =
      (policy == ssl_compliance_policy_cnsa_202407)
          ? static_cast<CipherScorer *>(&cnsa_scorer)
          : static_cast<CipherScorer *>(&aes_hw_scorer);
  CipherScorer::Score best_score = CipherScorer::kMinScore;

  while (CBS_len(&cipher_suites) > 0) {
    uint16_t cipher_suite;
    if (!CBS_get_u16(&cipher_suites, &cipher_suite)) {
      return nullptr;
    }

    // Limit to TLS 1.3 ciphers we know about.
    const SSL_CIPHER *candidate = SSL_get_cipher_by_value(cipher_suite);
    if (candidate == nullptr ||
        SSL_CIPHER_get_min_version(candidate) > version ||
        SSL_CIPHER_get_max_version(candidate) < version) {
      continue;
    }

    if (!ssl_tls13_cipher_meets_policy(SSL_CIPHER_get_protocol_id(candidate),
                                       policy)) {
      continue;
    }

    const CipherScorer::Score candidate_score = scorer->Evaluate(candidate);
    // |candidate_score| must be larger to displace the current choice. That way
    // the client's order controls between ciphers with an equal score.
    if (candidate_score > best_score) {
      best = candidate;
      best_score = candidate_score;
    }
  }

  return best;
}